

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O3

void ipc_ep_close(void *arg)

{
  void *pvVar1;
  
  nni_aio_close((nni_aio *)((long)arg + 0x228));
  nni_aio_close((nni_aio *)((long)arg + 0x60));
  nni_mtx_lock((nni_mtx *)arg);
  *(undefined1 *)((long)arg + 0x33) = 1;
  if (*(nng_stream_dialer **)((long)arg + 0x38) != (nng_stream_dialer *)0x0) {
    nng_stream_dialer_close(*(nng_stream_dialer **)((long)arg + 0x38));
  }
  if (*(nng_stream_listener **)((long)arg + 0x40) != (nng_stream_listener *)0x0) {
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x40));
  }
  if (*(nni_aio **)((long)arg + 0x58) != (nni_aio *)0x0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x58),NNG_ECLOSED);
    *(undefined8 *)((long)arg + 0x58) = 0;
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x408)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x408),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 0x28));
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x3f0)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x3f0),pvVar1)) {
    nni_pipe_close(*(nni_pipe **)((long)pvVar1 + 0x28));
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
ipc_ep_close(void *arg)
{
	ipc_ep   *ep = arg;
	ipc_pipe *p;

	nni_aio_close(&ep->time_aio);
	nni_aio_close(&ep->conn_aio);

	nni_mtx_lock(&ep->mtx);
	ep->closed = true;
	if (ep->dialer != NULL) {
		nng_stream_dialer_close(ep->dialer);
	}
	if (ep->listener != NULL) {
		nng_stream_listener_close(ep->listener);
	}
	if (ep->user_aio != NULL) {
		nni_aio_finish_error(ep->user_aio, NNG_ECLOSED);
		ep->user_aio = NULL;
	}
	NNI_LIST_FOREACH (&ep->nego_pipes, p) {
		nni_pipe_close(p->pipe);
	}
	NNI_LIST_FOREACH (&ep->wait_pipes, p) {
		nni_pipe_close(p->pipe);
	}
	nni_mtx_unlock(&ep->mtx);
}